

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O0

void av1_encode_mv(AV1_COMP *cpi,aom_writer *w,ThreadData_conflict *td,MV *mv,MV *ref,
                  nmv_context *mvctx,int usehp)

{
  MV_JOINT_TYPE type;
  int iVar1;
  int iVar2;
  short *in_RCX;
  long in_RDX;
  long in_RDI;
  short *in_R8;
  aom_writer *in_R9;
  int maxv;
  MV_JOINT_TYPE j;
  nmv_component *in_stack_00000010;
  MV diff;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  MV symb;
  
  symb.col = in_RCX[1] - in_R8[1];
  symb.row = *in_RCX - *in_R8;
  type = av1_get_mv_joint((MV *)&stack0xffffffffffffffcc);
  aom_write_symbol(in_R9,(int)symb,
                   (aom_cdf_prob *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc);
  iVar1 = mv_joint_vertical(type);
  if (iVar1 != 0) {
    encode_mv_component((aom_writer *)ref,mvctx._4_4_,in_stack_00000010,maxv._3_1_);
  }
  iVar1 = mv_joint_horizontal(type);
  if (iVar1 != 0) {
    encode_mv_component((aom_writer *)ref,mvctx._4_4_,in_stack_00000010,maxv._3_1_);
  }
  if (*(int *)(in_RDI + 0x609f0) != 0) {
    iVar1 = (int)*in_RCX;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    iVar2 = (int)in_RCX[1];
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    if (iVar2 < iVar1) {
      iVar1 = (int)*in_RCX;
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
    }
    else {
      iVar1 = (int)in_RCX[1];
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
    }
    iVar1 = iVar1 >> 3;
    if (iVar1 <= *(int *)(in_RDX + 0x25d5c)) {
      iVar1 = *(int *)(in_RDX + 0x25d5c);
    }
    *(int *)(in_RDX + 0x25d5c) = iVar1;
  }
  return;
}

Assistant:

void av1_encode_mv(AV1_COMP *cpi, aom_writer *w, ThreadData *td, const MV *mv,
                   const MV *ref, nmv_context *mvctx, int usehp) {
  const MV diff = { mv->row - ref->row, mv->col - ref->col };
  const MV_JOINT_TYPE j = av1_get_mv_joint(&diff);
  // If the mv_diff is zero, then we should have used near or nearest instead.
  assert(j != MV_JOINT_ZERO);
  if (cpi->common.features.cur_frame_force_integer_mv) {
    usehp = MV_SUBPEL_NONE;
  }
  aom_write_symbol(w, j, mvctx->joints_cdf, MV_JOINTS);
  if (mv_joint_vertical(j))
    encode_mv_component(w, diff.row, &mvctx->comps[0], usehp);

  if (mv_joint_horizontal(j))
    encode_mv_component(w, diff.col, &mvctx->comps[1], usehp);

  // If auto_mv_step_size is enabled then keep track of the largest
  // motion vector component used.
  if (cpi->sf.mv_sf.auto_mv_step_size) {
    int maxv = AOMMAX(abs(mv->row), abs(mv->col)) >> 3;
    td->max_mv_magnitude = AOMMAX(maxv, td->max_mv_magnitude);
  }
}